

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O3

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AddAnnotation
          (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,size_t begin_offset,
          size_t end_offset,string *file_path,vector<int,_std::allocator<int>_> *path)

{
  int iVar1;
  string *psVar2;
  Type *pTVar3;
  pointer piVar4;
  pointer piVar5;
  ulong uVar6;
  int iVar7;
  
  pTVar3 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::TypeHandler>
                     (&(this->annotation_proto_->annotation_).super_RepeatedPtrFieldBase,(Type *)0x0
                     );
  piVar4 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar5 != piVar4) {
    uVar6 = 0;
    do {
      iVar1 = piVar4[uVar6];
      iVar7 = (pTVar3->path_).current_size_;
      if (iVar7 == (pTVar3->path_).total_size_) {
        RepeatedField<int>::Reserve(&pTVar3->path_,iVar7 + 1);
        iVar7 = (pTVar3->path_).current_size_;
        piVar4 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      (pTVar3->path_).current_size_ = iVar7 + 1;
      ((pTVar3->path_).rep_)->elements[iVar7] = iVar1;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)piVar5 - (long)piVar4 >> 2));
  }
  *(byte *)(pTVar3->_has_bits_).has_bits_ = (byte)(pTVar3->_has_bits_).has_bits_[0] | 1;
  psVar2 = (pTVar3->source_file_).ptr_;
  if (psVar2 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar3->source_file_,file_path);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  pTVar3->begin_ = (int32)begin_offset;
  *(byte *)(pTVar3->_has_bits_).has_bits_ = (byte)(pTVar3->_has_bits_).has_bits_[0] | 6;
  pTVar3->end_ = (int32)end_offset;
  return;
}

Assistant:

virtual void AddAnnotation(size_t begin_offset, size_t end_offset,
                             const string& file_path,
                             const std::vector<int>& path) {
    typename AnnotationProto::Annotation* annotation =
        annotation_proto_->add_annotation();
    for (int i = 0; i < path.size(); ++i) {
      annotation->add_path(path[i]);
    }
    annotation->set_source_file(file_path);
    annotation->set_begin(begin_offset);
    annotation->set_end(end_offset);
  }